

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O2

void __thiscall tst_future::finally(tst_future *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar3;
  bool bVar4;
  PromiseData<QString> *pPVar5;
  QPromiseReject<int> *in_R8;
  char *reject;
  PromiseResolver<int> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_170;
  QPromiseBase<QString> local_168;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_158;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_150;
  _Any_data local_148;
  undefined **local_138;
  PromiseData<int> *pPStack_130;
  PromiseResolver<void> resolver_2;
  int value;
  undefined4 uStack_10c;
  QPromise<int> p;
  QPromise<int> output;
  _Any_data local_e8;
  _Manager_type local_d8;
  PromiseResolver<int> resolver;
  _Any_data local_a8 [2];
  Type input;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  QPromiseBase<void> local_38;
  
  local_148._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&input,(int *)local_148._M_pod_data);
  p.super_QPromiseBase<int>.m_d = input.super_QPromiseBase<int>.m_d;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
              ).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00129808;
  local_168._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001296c8;
  pPVar5 = (PromiseData<QString> *)operator_new(0x68);
  (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_settled = 0;
  (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData
       = 0;
  (pPVar5->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QString>::PromiseData(pPVar5);
  LOCK();
  pQVar1 = &(pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<QString> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8._M_unused._M_object = &PTR__QPromiseBase_00129ac8;
  local_168.m_d.d = pPVar5;
  local_e8._8_8_ = pPVar5;
  QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
            ((PromiseResolver<QString> *)&resolver,(QPromise<int> *)&local_e8);
  QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&local_e8);
  QVar3 = p.super_QPromiseBase<int>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver_1.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    resolver_1.m_d.d = resolver.m_d.d;
  }
  local_170.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_148._M_unused._0_8_ = resolver.m_d.d;
  local_148._8_8_ = resolver_1.m_d.d;
  local_a8[0]._0_8_ = resolver.m_d.d;
  local_58._M_unused._M_object = operator_new(0x18);
  *(void **)local_58._M_unused._0_8_ = local_148._M_unused._M_object;
  if ((Data *)local_148._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._M_unused._0_8_ = *local_148._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_148._8_8_;
  if ((Data *)local_148._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._8_8_ = *(int *)local_148._8_8_ + 1;
    UNLOCK();
  }
  pcStack_40 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<int,tst_future::finally()::$_0,void>::
  create<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(tst_future::finally()::$_0_const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_148._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  QVar3 = p.super_QPromiseBase<int>.m_d;
  local_148._M_unused._M_object = (void *)local_a8[0]._0_8_;
  if ((Data *)local_a8[0]._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_a8[0]._0_8_ = *(int *)local_a8[0]._0_8_ + 1;
    UNLOCK();
  }
  local_148._8_8_ = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_148._M_unused._M_object;
  if ((Data *)local_148._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._M_unused._0_8_ = *local_148._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_148._8_8_;
  if ((Data *)local_148._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._8_8_ = *(int *)local_148._8_8_ + 1;
    UNLOCK();
  }
  pcStack_60 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<int,tst_future::finally()::$_0,void>::
  create<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(tst_future::finally()::$_0_const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_148._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &local_170);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             local_a8[0]._M_pod_data);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &resolver_2);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> *)
             &resolver);
  local_168._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00129ac8;
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  QVar3.d = p.super_QPromiseBase<int>.m_d.d;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_00129808;
  output.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001295a0;
  pPVar5 = (PromiseData<QString> *)operator_new(0x68);
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_error).m_data.
  _M_exception_object = (void *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->m_settled = 0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->super_QSharedData = 0;
  (pPVar5->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData((PromiseData<int> *)pPVar5);
  LOCK();
  pQVar1 = &((PromiseDataBase<int,_void_(const_int_&)> *)
            &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<QString> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<int,_void_(const_int_&)> *)
              &pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8._M_unused._M_object = &PTR__QPromiseBase_00129808;
  output.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)pPVar5;
  local_e8._8_8_ = pPVar5;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&local_e8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_e8);
  QVar2.d = local_168.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_170.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_170 = resolver_1.m_d.d;
  }
  local_150.d = (Data *)0x0;
  if (local_170.d == (Data *)0x0) {
    local_158.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_158.d = local_170.d;
  }
  _value = (Data *)0x0;
  if (local_170.d != (Data *)0x0) {
    LOCK();
    ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_170.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPStack_130 = QVar3.d;
  if (QVar3.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_138 = &PTR__QPromiseBase_00129808;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  local_148._M_unused._0_8_ = (undefined8)local_170.d;
  local_148._8_8_ = local_158.d;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_148._M_unused._M_object;
  if ((Data *)local_148._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._M_unused._0_8_ = *local_148._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)local_148._8_8_;
  if ((Data *)local_148._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._8_8_ = *(int *)local_148._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_001295a0;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<int> *)pPStack_130;
  if (pPStack_130 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPStack_130->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_00129808;
  QtPromisePrivate::
  PromiseHandler<QString,QtPromise::QPromiseBase<int>::finally<tst_future::finally()::$_0>(tst_future::finally()::$_0)const::{lambda(QString_const&)#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromiseBase<int>::finally<tst_future::finally()::$_0>(tst_future::finally()::$_0)const::{lambda(QString_const&)#1}()#1}const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(QString_const&)#1}::~function((_lambda_QString_const___1_ *)local_148._M_pod_data);
  QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>,
             (function<void_(const_QString_&)> *)&resolver);
  std::_Function_base::~_Function_base((_Function_base *)&resolver);
  QVar2.d = local_168.m_d.d;
  QtPromisePrivate::PromiseCatcher<QString,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_a8,
             (PromiseCatcher<QString,decltype(nullptr),void> *)0x0,&local_170,
             (QPromiseResolve<int> *)&local_158,in_R8);
  QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_a8);
  std::_Function_base::~_Function_base((_Function_base *)local_a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_158);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&value);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_170);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_150);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  output.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00129808;
  bVar4 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                    (&(local_168.m_d.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::dispatch
              (&(local_168.m_d.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>);
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver_2);
  QtPromise::QPromiseBase<QString>::~QPromiseBase(&local_168);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                    (&(input.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_148._M_pod_data[0] = bVar4;
  local_e8._M_pod_data[0] = 1;
  bVar4 = QTest::qCompare<bool,bool>
                    ((bool *)local_148._M_pod_data,(bool *)local_e8._M_pod_data,
                     "input.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                     ,0x148);
  if (bVar4) {
    bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(output.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    local_148._M_pod_data[0] = bVar4;
    local_e8._M_pod_data[0] = 1;
    reject = 
    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
    ;
    bVar4 = QTest::qCompare<bool,bool>
                      ((bool *)local_148._M_pod_data,(bool *)local_e8._M_pod_data,
                       "output.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                       ,0x149);
    if (bVar4) {
      value = 0xffffffff;
      local_168._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00129570;
      pPVar5 = (PromiseData<QString> *)operator_new(0x58);
      (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.size = 0;
      (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.size = 0;
      (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&(pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_lock = 0;
      *(undefined8 *)&(pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_settled = 0
      ;
      (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
           (_func_int **)0x0;
      *(undefined8 *)
       &(pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData = 0;
      (pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.m_data.
      _M_exception_object = (void *)0x0;
      QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)pPVar5);
      LOCK();
      pQVar1 = &(pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (pPVar5 != (PromiseData<QString> *)0x0) {
        LOCK();
        pQVar1 = &(pPVar5->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData
        ;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001296f8;
      local_168.m_d.d = pPVar5;
      p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)pPVar5;
      QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_2,(QPromise<void> *)&p);
      QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&p);
      QVar3 = output.super_QPromiseBase<int>.m_d;
      if (resolver_2.m_d.d == (Data *)0x0) {
        resolver_1.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0
        ;
      }
      else {
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
        UNLOCK();
        resolver_1.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)resolver_2;
      }
      local_170.d = (Data *)0x0;
      if (resolver_1.m_d.d == (Data *)0x0) {
        local_150.d = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)
                 &((Data *)resolver_1.m_d.d)->super_QSharedData)->_vptr_PromiseDataBase =
             *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)
                      &((Data *)resolver_1.m_d.d)->super_QSharedData)->_vptr_PromiseDataBase + 1;
        UNLOCK();
        local_150 = resolver_1.m_d.d;
      }
      local_158.d = (Data *)0x0;
      if (resolver_1.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)
                 &((Data *)resolver_1.m_d.d)->super_QSharedData)->_vptr_PromiseDataBase =
             *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)
                      &((Data *)resolver_1.m_d.d)->super_QSharedData)->_vptr_PromiseDataBase + 1;
        UNLOCK();
      }
      if ((PromiseData<QString> *)local_150.d != (PromiseData<QString> *)0x0) {
        LOCK();
        *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)
                 &((PromiseData<QString> *)local_150.d)->
                  super_PromiseDataBase<QString,_void_(const_QString_&)>)->_vptr_PromiseDataBase =
             *(int *)&((PromiseDataBase<int,_void_(const_int_&)> *)
                      &((PromiseData<QString> *)local_150.d)->
                       super_PromiseDataBase<QString,_void_(const_QString_&)>)->
                      _vptr_PromiseDataBase + 1;
        UNLOCK();
      }
      local_d8 = (_Manager_type)&value;
      local_148._M_unused._M_object = (void *)0x0;
      local_148._8_8_ = (Data *)0x0;
      local_138 = (undefined **)0x0;
      pPStack_130 = (PromiseData<int> *)0x0;
      local_e8._M_unused._0_8_ = resolver_1.m_d.d;
      local_e8._8_8_ = local_150.d;
      local_148._M_unused._M_object = operator_new(0x18);
      *(void **)local_148._M_unused._0_8_ = local_e8._M_unused._M_object;
      if ((PromiseData<int> *)local_e8._M_unused._0_8_ != (PromiseData<int> *)0x0) {
        LOCK();
        *(int *)local_e8._M_unused._0_8_ = *local_e8._M_unused._M_object + 1;
        UNLOCK();
      }
      *(undefined8 *)((long)local_148._M_unused._0_8_ + 8) = local_e8._8_8_;
      if ((PromiseData<QString> *)local_e8._8_8_ != (PromiseData<QString> *)0x0) {
        LOCK();
        *(int *)local_e8._8_8_ = *(int *)local_e8._8_8_ + 1;
        UNLOCK();
      }
      *(_Manager_type *)((long)local_148._M_unused._0_8_ + 0x10) = local_d8;
      pPStack_130 = (PromiseData<int> *)
                    std::
                    _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                    ::_M_invoke;
      local_138 = (undefined **)
                  std::
                  _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_manager;
      QtPromisePrivate::PromiseHandler<int,tst_future::finally()::$_1,int>::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_future::finally()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
      ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)&local_e8);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_int_&)> *)&local_148);
      std::_Function_base::~_Function_base((_Function_base *)&local_148);
      QVar3 = output.super_QPromiseBase<int>.m_d;
      QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_e8,
                 (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&resolver_1,
                 (QPromiseResolve<void> *)&local_150,(QPromiseReject<void> *)reject);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_e8);
      std::_Function_base::~_Function_base((_Function_base *)&local_e8);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &local_150);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &local_158);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &resolver_1);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 &local_170);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&resolver_2.m_d);
      local_168._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001296f8;
      bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        (&(output.super_QPromiseBase<int>.m_d.d)->
                          super_PromiseDataBase<int,_void_(const_int_&)>);
      if (!bVar4) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                  (&(output.super_QPromiseBase<int>.m_d.d)->
                    super_PromiseDataBase<int,_void_(const_int_&)>);
      }
      QtPromise::QPromiseBase<void>::wait(&local_38,&local_168);
      QtPromise::QPromiseBase<void>::~QPromiseBase(&local_38);
      QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_168);
      bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                        (&(output.super_QPromiseBase<int>.m_d.d)->
                          super_PromiseDataBase<int,_void_(const_int_&)>);
      p.super_QPromiseBase<int>._vptr_QPromiseBase =
           (_func_int **)CONCAT71(p.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,bVar4);
      local_168._vptr_QPromiseBase = (_func_int **)CONCAT71(local_168._vptr_QPromiseBase._1_7_,1);
      bVar4 = QTest::qCompare<bool,bool>
                        ((bool *)&p,(bool *)&local_168,"output.isFulfilled()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                         ,0x152);
      if (bVar4) {
        QTest::qCompare(value,0x2a,"value","42",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                        ,0x153);
      }
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&output.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&input.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_future::finally()
{
    auto input = QtPromise::resolve(42);
    auto output = input.finally([]() {
        return QtConcurrent::run([]() {
            return QString{"foo"};
        });
    });

    Q_STATIC_ASSERT((std::is_same<decltype(output), QtPromise::QPromise<int>>::value));

    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isPending(), true);

    int value = -1;
    output
        .then([&](int res) {
            value = res;
        })
        .wait();

    QCOMPARE(output.isFulfilled(), true);
    QCOMPARE(value, 42);
}